

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O0

int arkStep_ComputeState(ARKodeMem ark_mem,N_Vector zcor,N_Vector z)

{
  undefined8 in_RDX;
  undefined8 in_RSI;
  ARKodeARKStepMem step_mem;
  int retval;
  ARKodeARKStepMem *in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int local_4;
  
  local_4 = arkStep_AccessStepMem
                      ((ARKodeMem)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                       in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  if (local_4 == 0) {
    N_VLinearSum(0,*(undefined8 *)(in_stack_ffffffffffffffd0 + 0x50),in_RSI,in_RDX);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int arkStep_ComputeState(ARKodeMem ark_mem, N_Vector zcor, N_Vector z)
{
  int retval;
  ARKodeARKStepMem step_mem;

  /* access ARKodeARKStepMem structure */
  retval = arkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  N_VLinearSum(ONE, step_mem->zpred, ONE, zcor, z);

  return (ARK_SUCCESS);
}